

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array.cpp
# Opt level: O0

void __thiscall Omega_h::Write<double>::Write(Write<double> *this,HostWrite<double> *host_write)

{
  size_t in_RCX;
  void *in_RDX;
  Write<signed_char> local_28;
  HostWrite<double> *local_18;
  HostWrite<double> *host_write_local;
  Write<double> *this_local;
  
  local_18 = host_write;
  host_write_local = (HostWrite<double> *)this;
  HostWrite<double>::write((HostWrite<double> *)&local_28,(int)host_write,in_RDX,in_RCX);
  Write(this,&local_28);
  ~Write((Write<double> *)&local_28);
  return;
}

Assistant:

Write<T>::Write(HostWrite<T> host_write) : Write<T>(host_write.write()) {}